

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataQueue.cpp
# Opt level: O2

void __thiscall MinVR::VRDataQueue::addQueue(VRDataQueue *this,VRDataQueue *newQueue)

{
  longlong timeStamp;
  _Base_ptr p_Var1;
  _Self __tmp;
  undefined1 auStack_58 [40];
  
  if ((newQueue->_dataMap)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    for (p_Var1 = (newQueue->_dataMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var1 != &(newQueue->_dataMap)._M_t._M_impl.super__Rb_tree_header;
        p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
      timeStamp = *(longlong *)(p_Var1 + 1);
      VRDataQueueItem::VRDataQueueItem
                ((VRDataQueueItem *)auStack_58,(VRDataQueueItem *)&p_Var1[1]._M_left);
      push(this,timeStamp,(VRDataQueueItem *)auStack_58);
      std::__cxx11::string::~string((string *)(auStack_58 + 8));
    }
  }
  return;
}

Assistant:

VRDataQueue::serialData VRDataQueue::serialize() {

  std::ostringstream lenStr;
  lenStr << _dataMap.size();

  VRDataQueue::serialData out;

  out = "<VRDataQueue num=\"" + lenStr.str() + "\">";
  for (VRDataList::iterator it = _dataMap.begin(); it != _dataMap.end(); ++it) {
    std::ostringstream timeStamp;
    timeStamp << it->first.first << "-" << std::setfill('0') << std::setw(3) << it->first.second;
    out += "<VRDataQueueItem timeStamp=\"" + timeStamp.str() + "\">" +
      it->second.serialize() + "</VRDataQueueItem>";
  }
  out += "</VRDataQueue>";

  return out;
}